

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

UBool currency_cleanup(void)

{
  CReg *this;
  Hashtable *this_00;
  long lVar1;
  void *in_RSI;
  
  while (this = gCRegHead, gCRegHead != (CReg *)0x0) {
    gCRegHead = gCRegHead->next;
    icu_63::UMemory::operator_delete((UMemory *)this,in_RSI);
  }
  lVar1 = 0;
  do {
    if (*(CurrencyNameCacheEntry **)((long)currCache + lVar1) != (CurrencyNameCacheEntry *)0x0) {
      deleteCacheEntry(*(CurrencyNameCacheEntry **)((long)currCache + lVar1));
      *(undefined8 *)((long)currCache + lVar1) = 0;
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x50);
  if (gIsoCodes != (UHashtable *)0x0) {
    uhash_close_63(gIsoCodes);
    gIsoCodes = (UHashtable *)0x0;
  }
  this_00 = gCurrSymbolsEquiv;
  LOCK();
  gIsoCodesInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  if ((gCurrSymbolsEquiv != (Hashtable *)0x0) && (gCurrSymbolsEquiv->hash != (UHashtable *)0x0)) {
    uhash_close_63(gCurrSymbolsEquiv->hash);
  }
  icu_63::UMemory::operator_delete((UMemory *)this_00,in_RSI);
  gCurrSymbolsEquiv = (Hashtable *)0x0;
  LOCK();
  gCurrSymbolsEquivInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  return '\x01';
}

Assistant:

static void cleanup(void) {
        while (gCRegHead) {
            CReg* n = gCRegHead;
            gCRegHead = gCRegHead->next;
            delete n;
        }
    }